

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void GenCodeLoadInt64FromPointer
               (CodeGenRegVmContext *ctx,x86Reg tempReg,x86Reg targetReg,uchar reg,uint offset)

{
  if ((byte)(reg - 1) < 3) {
    tempReg = (&UINT_001f84b0)[(byte)(reg - 1)];
  }
  else {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,tempReg,sQWORD,rEBX,(uint)reg << 3);
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,targetReg,sQWORD,tempReg,offset);
  return;
}

Assistant:

void GenCodeLoadInt64FromPointer(CodeGenRegVmContext &ctx, x86Reg tempReg, x86Reg targetReg, unsigned char reg, unsigned offset)
{
	if(reg == rvrrRegisters)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rREG, offset); // Load long value
	}
	else if(reg == rvrrFrame)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rR15, offset); // Load long value
	}
	else if(reg == rvrrConstants)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rR14, offset); // Load long value
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, tempReg, sQWORD, rREG, reg * 8); // Load source pointer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, tempReg, offset); // Load long value
	}
}